

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::setStateWeight(L2NormCost *this,VectorDynSize *stateWeights)

{
  bool bVar1;
  char *pcVar2;
  
  if ((this->m_pimpl->stateCost).m_valid == true) {
    bVar1 = CostAttributes::setWeightMatrix(&this->m_pimpl->stateCost,stateWeights);
    if (bVar1) {
      return true;
    }
    pcVar2 = "Error when specifying the state weights.";
  }
  else {
    pcVar2 = "The state cost portion has been deactivated, given the provided selectors.";
  }
  iDynTree::reportError("L2NormCost","setStateWeight",pcVar2);
  return false;
}

Assistant:

bool L2NormCost::setStateWeight(const VectorDynSize &stateWeights)
        {
            if (!(m_pimpl->stateCost.isValid())) {
                reportError("L2NormCost", "setStateWeight", "The state cost portion has been deactivated, given the provided selectors.");
                return false;
            }

            if (!(m_pimpl->stateCost.setWeightMatrix(stateWeights))) {
                reportError("L2NormCost", "setStateWeight", "Error when specifying the state weights.");
                return false;
            }

            return true;
        }